

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

int Fra_SmlNodeNotEquWeight(Fra_Sml_t *p,int Left,int Right)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  int local_30;
  int local_2c;
  int Counter;
  int k;
  uint *pSimR;
  uint *pSimL;
  int Right_local;
  int Left_local;
  Fra_Sml_t *p_local;
  
  local_30 = 0;
  puVar2 = Fra_ObjSim(p,Left);
  puVar3 = Fra_ObjSim(p,Right);
  for (local_2c = p->nWordsPref; local_2c < p->nWordsTotal; local_2c = local_2c + 1) {
    iVar1 = Aig_WordCountOnes(puVar2[local_2c] ^ puVar3[local_2c]);
    local_30 = iVar1 + local_30;
  }
  return local_30;
}

Assistant:

int Fra_SmlNodeNotEquWeight( Fra_Sml_t * p, int Left, int Right )
{
    unsigned * pSimL, * pSimR;
    int k, Counter = 0;
    pSimL = Fra_ObjSim( p, Left );
    pSimR = Fra_ObjSim( p, Right );
    for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
        Counter += Aig_WordCountOnes( pSimL[k] ^ pSimR[k] );
    return Counter;
}